

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_iterators.h
# Opt level: O1

void __thiscall
st_tree::detail::
d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
::d1st_post_iterator
          (d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
           *this,value_type *root)

{
  pointer pfVar1;
  pointer ppnVar2;
  frame local_58;
  
  this->_vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ec58;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stack).
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (root != (value_type *)0x0) {
    local_58.second._base._M_current =
         (root->
         super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
         )._children.
         super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._vptr_frame = (_func_int **)&PTR__frame_0030ec88;
    local_58.second._vptr_valmap_iterator_adaptor_random =
         (_func_int **)&PTR__valmap_iterator_adaptor_random_0030e4b0;
    local_58.visited = false;
    local_58.first = root;
    std::
    vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>>
    ::
    emplace_back<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>
              ((vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>>
                *)&this->_stack,&local_58);
    pfVar1 = (this->_stack).
             super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppnVar2 = ((pfVar1[-1].first)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
              )._children.
              super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppnVar2 !=
        ((pfVar1[-1].first)->
        super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
        )._children.
        super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_58.first = *ppnVar2;
        local_58.second._base._M_current =
             ((local_58.first)->
             super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             )._children.
             super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58._vptr_frame = (_func_int **)&PTR__frame_0030ec88;
        local_58.second._vptr_valmap_iterator_adaptor_random =
             (_func_int **)&PTR__valmap_iterator_adaptor_random_0030e4b0;
        local_58.visited = false;
        std::
        vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>>
        ::
        emplace_back<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>
                  ((vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame,std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>,st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>const,std::allocator<int>>::frame>>
                    *)&this->_stack,&local_58);
        pfVar1 = (this->_stack).
                 super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppnVar2 = ((pfVar1[-1].first)->
                  super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
                  )._children.
                  super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (ppnVar2 !=
               ((pfVar1[-1].first)->
               super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
               )._children.
               super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pfVar1[-1].visited = true;
  }
  return;
}

Assistant:

d1st_post_iterator(value_type* root) {
        if (root == NULL) return;
        _stack.push_back(frame(const_cast<node_type*>(root), iterator(const_cast<node_type*>(root)->begin()), false));
        while (true) {
            if (_stack.back().first->empty()) {
                _stack.back().visited = true;
                break;
            }
            iterator b(_stack.back().first->begin());
            _stack.push_back(frame(&*b, iterator((b)->begin()), false));
        }
    }